

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_func_queue_examples.cpp
# Opt level: O0

void density_tests::
     SpFunctionQueueSamples<(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1>
     ::func_queue_reentrant_put_samples(ostream *i_ostream)

{
  type_conflict tVar1;
  bool bVar2;
  double *pdVar3;
  void *this;
  value_type *pvVar4;
  Func_conflict *pFVar5;
  ostream *in_RDI;
  bool invoked_2;
  reentrant_put_transaction<Func> transaction_1;
  sp_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  queue_4;
  bool invoked_1;
  reentrant_put_transaction<typename_std::decay<Func>::type> transaction;
  sp_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  queue_3;
  bool invoked;
  sp_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  queue_2;
  type return_value;
  int i;
  sp_function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  queue_1;
  anon_class_8_1_90f47376 func;
  double last_val;
  sp_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  queue;
  PrintScopeDuration dur;
  reentrant_put_transaction<Func> local_4c0;
  reentrant_put_transaction<Func> local_4a0;
  sp_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_480;
  undefined1 local_3d1;
  Func_conflict local_3d0;
  reentrant_put_transaction<typename_std::decay<Func>::type> local_3c0;
  reentrant_put_transaction<Func> local_3a0;
  sp_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_380;
  undefined1 local_2c5;
  int local_2c4;
  sp_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_2c0;
  int local_21c;
  undefined1 local_218 [24];
  sp_function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_200;
  anon_class_8_1_90f47376 local_168;
  double local_160;
  anon_class_1_0_00000001 local_157;
  anon_class_1_0_00000001 local_156;
  anon_class_1_0_00000001 local_155 [20];
  anon_class_1_0_00000001 local_141;
  sp_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  local_140;
  PrintScopeDuration local_88 [2];
  
  PrintScopeDuration::PrintScopeDuration
            (local_88,in_RDI,"spin-locking function queue reentrant put samples");
  density::
  sp_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_function_queue(&local_140);
  density::
  sp_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::
  reentrant_push<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_1_>
            ((sp_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
              *)&local_140,&local_141);
  density::
  sp_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::
  reentrant_push<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_2_>
            ((sp_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
              *)&local_140,local_155);
  density::
  sp_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::
  reentrant_push<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_3_>
            ((sp_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
              *)&local_140,&local_156);
  density::
  sp_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::
  reentrant_push<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_4_>
            ((sp_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
              *)&local_140,&local_157);
  do {
    tVar1 = density::
            sp_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
            ::try_reentrant_consume(&local_140);
  } while (tVar1);
  density::
  sp_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_function_queue(&local_140);
  local_160 = 1.0;
  local_168.last_val = &local_160;
  density::
  sp_function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_function_queue(&local_200);
  for (local_218._20_4_ = 0; (int)local_218._20_4_ < 10; local_218._20_4_ = local_218._20_4_ + 1) {
    density::
    sp_function_queue<double(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
    ::
    reentrant_push<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1>::func_queue_reentrant_put_samples(std::ostream&)::_lambda()_5_&>
              ((sp_function_queue<double(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
                *)&local_200,&local_168);
  }
  do {
    density::
    sp_function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
    ::try_reentrant_consume
              ((sp_function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
                *)local_218);
    bVar2 = density::builtin_optional::operator_cast_to_bool((builtin_optional *)local_218);
    if (bVar2) {
      pdVar3 = density::builtin_optional<double>::operator*((builtin_optional<double> *)local_218);
      this = (void *)std::ostream::operator<<(&std::cout,*pdVar3);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      local_21c = 0;
    }
    else {
      local_21c = 8;
    }
    density::builtin_optional<double>::~builtin_optional((builtin_optional<double> *)local_218);
  } while (local_21c == 0);
  density::
  sp_function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_function_queue(&local_200);
  density::
  sp_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_function_queue(&local_2c0);
  local_2c4 = 7;
  density::
  sp_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::
  reentrant_emplace<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1>::func_queue_reentrant_put_samples(std::ostream&)::Func,int>
            ((sp_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
              *)&local_2c0,&local_2c4);
  local_2c5 = density::
              sp_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
              ::try_reentrant_consume(&local_2c0);
  if (!(bool)local_2c5) {
    __assert_fail("invoked",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_func_queue_examples.cpp"
                  ,0x1b6,
                  "static void density_tests::SpFunctionQueueSamples<density::function_standard_erasure, density::concurrency_single, density::concurrency_multiple>::func_queue_reentrant_put_samples(std::ostream &) [ERASURE = density::function_standard_erasure, PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_function_queue(&local_2c0);
  density::
  sp_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_function_queue(&local_380);
  local_3d0.m_string_1 = (char *)0x0;
  local_3d0.m_string_2 = (char *)0x0;
  density::
  sp_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::
  start_reentrant_push<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1>::func_queue_reentrant_put_samples(std::ostream&)::Func>
            (&local_3c0,
             (sp_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
              *)&local_380,&local_3d0);
  density::
  sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::
  reentrant_put_transaction<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1>::func_queue_reentrant_put_samples(std::ostream&)::Func>
  ::
  reentrant_put_transaction<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1>::func_queue_reentrant_put_samples(std::ostream&)::Func,void>
            ((reentrant_put_transaction<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1>::func_queue_reentrant_put_samples(std::ostream&)::Func>
              *)&local_3a0,&local_3c0);
  density::
  sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<Func>::~reentrant_put_transaction(&local_3c0);
  pvVar4 = density::
           sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
           ::reentrant_put_transaction<Func>::raw_allocate_copy<char[12]>
                     (&local_3a0,(char (*) [12])"Hello world");
  pFVar5 = density::
           sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
           ::reentrant_put_transaction<Func>::element<Func,_nullptr>(&local_3a0);
  pFVar5->m_string_1 = pvVar4;
  pvVar4 = density::
           sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
           ::reentrant_put_transaction<Func>::raw_allocate_copy<char[18]>
                     (&local_3a0,(char (*) [18])"\t(I\'m so happy)!!");
  pFVar5 = density::
           sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
           ::reentrant_put_transaction<Func>::element<Func,_nullptr>(&local_3a0);
  pFVar5->m_string_2 = pvVar4;
  density::
  sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<Func>::commit(&local_3a0);
  local_3d1 = density::
              sp_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
              ::try_reentrant_consume(&local_380);
  if (!(bool)local_3d1) {
    __assert_fail("invoked",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_func_queue_examples.cpp"
                  ,0x1dc,
                  "static void density_tests::SpFunctionQueueSamples<density::function_standard_erasure, density::concurrency_single, density::concurrency_multiple>::func_queue_reentrant_put_samples(std::ostream &) [ERASURE = density::function_standard_erasure, PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<Func>::~reentrant_put_transaction(&local_3a0);
  density::
  sp_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_function_queue(&local_380);
  density::
  sp_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::sp_function_queue(&local_480);
  density::
  sp_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::
  start_reentrant_emplace<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1>::func_queue_reentrant_put_samples(std::ostream&)::Func>
            (&local_4c0,
             (sp_function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
              *)&local_480);
  density::
  sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,density::default_busy_wait>
  ::
  reentrant_put_transaction<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1>::func_queue_reentrant_put_samples(std::ostream&)::Func>
  ::
  reentrant_put_transaction<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1>::func_queue_reentrant_put_samples(std::ostream&)::Func,void>
            ((reentrant_put_transaction<density_tests::SpFunctionQueueSamples<(density::function_type_erasure)0,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1>::func_queue_reentrant_put_samples(std::ostream&)::Func>
              *)&local_4a0,&local_4c0);
  density::
  sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<Func>::~reentrant_put_transaction(&local_4c0);
  pvVar4 = density::
           sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
           ::reentrant_put_transaction<Func>::raw_allocate_copy<char[12]>
                     (&local_4a0,(char (*) [12])"Hello world");
  pFVar5 = density::
           sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
           ::reentrant_put_transaction<Func>::element<Func,_nullptr>(&local_4a0);
  pFVar5->m_string_1 = pvVar4;
  pvVar4 = density::
           sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
           ::reentrant_put_transaction<Func>::raw_allocate_copy<char[18]>
                     (&local_4a0,(char (*) [18])"\t(I\'m so happy)!!");
  pFVar5 = density::
           sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
           ::reentrant_put_transaction<Func>::element<Func,_nullptr>(&local_4a0);
  pFVar5->m_string_2 = pvVar4;
  density::
  sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<Func>::commit(&local_4a0);
  tVar1 = density::
          sp_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
          ::try_reentrant_consume(&local_480);
  if (!tVar1) {
    __assert_fail("invoked",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/sp_func_queue_examples.cpp"
                  ,0x200,
                  "static void density_tests::SpFunctionQueueSamples<density::function_standard_erasure, density::concurrency_single, density::concurrency_multiple>::func_queue_reentrant_put_samples(std::ostream &) [ERASURE = density::function_standard_erasure, PROD_CARDINALITY = density::concurrency_single, CONSUMER_CARDINALITY = density::concurrency_multiple]"
                 );
  }
  density::
  sp_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::reentrant_put_transaction<Func>::~reentrant_put_transaction(&local_4a0);
  density::
  sp_function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
  ::~sp_function_queue(&local_480);
  PrintScopeDuration::~PrintScopeDuration(local_88);
  return;
}

Assistant:

static void func_queue_reentrant_put_samples(std::ostream & i_ostream)
        {
            PrintScopeDuration dur(i_ostream, "spin-locking function queue reentrant put samples");

            using namespace density;

            {
                //! [sp_function_queue reentrant_push example 1]
                sp_function_queue<
                  void(),
                  default_allocator,
                  ERASURE,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY>
                  queue;
                queue.reentrant_push([] { std::cout << "Hello"; });
                queue.reentrant_push([] { std::cout << " world"; });
                queue.reentrant_push([] { std::cout << "!!!"; });
                queue.reentrant_push([] { std::cout << std::endl; });
                while (queue.try_reentrant_consume())
                    ;
                //! [sp_function_queue reentrant_push example 1]
            }
            {
                //! [sp_function_queue reentrant_push example 2]
                double last_val = 1.;

                auto func = [&last_val] { return last_val /= 2.; };

                sp_function_queue<
                  double(),
                  default_allocator,
                  ERASURE,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY>
                  queue;
                for (int i = 0; i < 10; i++)
                    queue.reentrant_push(func);

                while (auto const return_value = queue.try_reentrant_consume())
                    std::cout << *return_value << std::endl;
                //! [sp_function_queue reentrant_push example 2]
            }
            {
                //! [sp_function_queue reentrant_emplace example 1]
                /* This local struct is unmovable and uncopyable, so emplace is the only
                    option to add it to the queue. Note that operator () returns an int,
                    but we add it to a void() function queue. This is ok, as we are just
                    discarding the return value. */
                struct Func
                {
                    int const m_value;

                    Func(int i_value) : m_value(i_value) {}

                    Func(const Func &) = delete;
                    Func & operator=(const Func &) = delete;

                    int operator()() const
                    {
                        std::cout << m_value << std::endl;
                        return m_value;
                    }
                };

                sp_function_queue<
                  void(),
                  default_allocator,
                  ERASURE,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY>
                  queue;
                queue.template reentrant_emplace<Func>(7);

                bool const invoked = queue.try_reentrant_consume();
                assert(invoked);
                //! [sp_function_queue reentrant_emplace example 1]
                (void)invoked;
            }
            {
                //! [sp_function_queue start_reentrant_push example 1]
                struct Func
                {
                    const char * m_string_1;
                    const char * m_string_2;

                    void operator()()
                    {
                        std::cout << m_string_1 << std::endl;
                        std::cout << m_string_2 << std::endl;
                    }
                };

                sp_function_queue<
                  void(),
                  default_allocator,
                  ERASURE,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY>
                  queue;

                auto transaction = queue.start_reentrant_push(Func{});

                // in case of exception here, since the transaction is not committed, it is discarded with no observable effects
                transaction.element().m_string_1 = transaction.raw_allocate_copy("Hello world");
                transaction.element().m_string_2 =
                  transaction.raw_allocate_copy("\t(I'm so happy)!!");

                transaction.commit();

                // now transaction is empty

                bool const invoked = queue.try_reentrant_consume();
                assert(invoked);
                //! [sp_function_queue start_reentrant_push example 1]
                (void)invoked;
            }
            {
                //! [sp_function_queue start_reentrant_emplace example 1]
                struct Func
                {
                    const char * m_string_1;
                    const char * m_string_2;

                    void operator()()
                    {
                        std::cout << m_string_1 << std::endl;
                        std::cout << m_string_2 << std::endl;
                    }
                };

                sp_function_queue<
                  void(),
                  default_allocator,
                  ERASURE,
                  PROD_CARDINALITY,
                  CONSUMER_CARDINALITY>
                  queue;

                auto transaction = queue.template start_reentrant_emplace<Func>();

                // in case of exception here, since the transaction is not committed, it is discarded with no observable effects
                transaction.element().m_string_1 = transaction.raw_allocate_copy("Hello world");
                transaction.element().m_string_2 =
                  transaction.raw_allocate_copy("\t(I'm so happy)!!");

                transaction.commit();

                bool const invoked = queue.try_reentrant_consume();
                assert(invoked);
                //! [sp_function_queue start_reentrant_emplace example 1]
                (void)invoked;
            }
        }